

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InterfaceBlockDataSizeTestCase::iterate
          (InterfaceBlockDataSizeTestCase *this)

{
  Program *programDefinition;
  code *pcVar1;
  ProgramInterface interface;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  size_type sVar6;
  const_reference pvVar7;
  undefined4 extraout_var_00;
  undefined8 uVar8;
  MessageBuilder *pMVar9;
  ProgramInterface local_87c;
  MessageBuilder local_870;
  MessageBuilder local_6f0;
  MessageBuilder local_570;
  undefined4 local_3f0;
  undefined4 local_3ec;
  GLenum prop;
  int local_264;
  int local_260;
  GLint queryDataSize;
  int expectedMinDataSize;
  GLuint resourceNdx;
  Functions *gl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  allocator<char> local_209;
  string local_208;
  ScopedLogSection local_1e8;
  ScopedLogSection section;
  int blockNdx;
  ProgramSources local_1d0;
  undefined1 local_100 [8];
  ShaderProgram program;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  blockNames;
  GLenum programGLInterfaceValue;
  ProgramInterface programInterface;
  InterfaceBlockDataSizeTestCase *this_local;
  
  if ((this->super_InterfaceBlockBaseCase).m_storage == STORAGE_UNIFORM) {
    local_87c = PROGRAMINTERFACE_UNIFORM_BLOCK;
  }
  else {
    local_87c = PROGRAMINTERFACE_LAST;
    if ((this->super_InterfaceBlockBaseCase).m_storage == STORAGE_BUFFER) {
      local_87c = PROGRAMINTERFACE_SHADER_STORAGE_BLOCK;
    }
  }
  interface = getProgramInterfaceGLEnum(local_87c);
  getProgramInterfaceResourceList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&program.m_program.m_info.linkTimeUs,
             (Functional *)(this->super_InterfaceBlockBaseCase).m_program,
             (Program *)(ulong)local_87c,interface);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.m_context);
  generateProgramInterfaceProgramSources(&local_1d0,(this->super_InterfaceBlockBaseCase).m_program);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar4,&local_1d0);
  glu::ProgramSources::~ProgramSources(&local_1d0);
  tcu::TestContext::setTestResult
            ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  programDefinition = (this->super_InterfaceBlockBaseCase).m_program;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog
                     ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  checkAndLogProgram((ShaderProgram *)local_100,programDefinition,
                     (Functions *)CONCAT44(extraout_var,iVar2),pTVar5);
  for (section.m_log._0_4_ = 0; iVar2 = (int)section.m_log,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&program.m_program.m_info.linkTimeUs), iVar2 < (int)sVar6;
      section.m_log._0_4_ = (int)section.m_log + 1) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Block",&local_209);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&program.m_program.m_info.linkTimeUs,(long)(int)section.m_log);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl,
                   "Block \"",pvVar7);
    std::operator+(&local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gl,"\"");
    tcu::ScopedLogSection::ScopedLogSection(&local_1e8,pTVar5,&local_208,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&gl);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    pRVar4 = gles31::Context::getRenderContext
                       ((this->super_InterfaceBlockBaseCase).super_TestCase.m_context);
    iVar2 = (*pRVar4->_vptr_RenderContext[3])();
    _expectedMinDataSize = CONCAT44(extraout_var_00,iVar2);
    pcVar1 = *(code **)(_expectedMinDataSize + 0x9a8);
    dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&program.m_program.m_info.linkTimeUs,(long)(int)section.m_log);
    uVar8 = std::__cxx11::string::c_str();
    queryDataSize = (*pcVar1)(dVar3,interface,uVar8);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&program.m_program.m_info.linkTimeUs,(long)(int)section.m_log);
    local_260 = getBlockMinDataSize(this,pvVar7);
    local_264 = -1;
    dVar3 = (**(code **)(_expectedMinDataSize + 0x800))();
    glu::checkError(dVar3,"query resource index",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x835);
    if (queryDataSize == -1) {
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&prop,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&prop,
                          (char (*) [63])
                          "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"");
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&program.m_program.m_info.linkTimeUs,(long)(int)section.m_log);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,pvVar7);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b3d55e);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&prop);
      tcu::TestContext::setTestResult
                ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Resource not found");
      local_3ec = 4;
    }
    else {
      local_3f0 = 0x9303;
      pcVar1 = *(code **)(_expectedMinDataSize + 0x9c8);
      dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_100);
      (*pcVar1)(dVar3,interface,queryDataSize,1,&local_3f0,1,0,&local_264);
      dVar3 = (**(code **)(_expectedMinDataSize + 0x800))();
      glu::checkError(dVar3,"query resource BUFFER_DATA_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                      ,0x843);
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_570,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_570,(char (*) [20])0x2c168f9);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_264);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b8f97b);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(char (*) [38])"Buffer data size with tight packing: ");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_260);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_570);
      if (local_264 < local_260) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_6f0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_6f0,
                            (char (*) [58])
                            "Error, buffer size was less than minimum buffer data size");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6f0);
        tcu::TestContext::setTestResult
                  ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_FAIL,"Buffer data size invalid");
        local_3ec = 4;
      }
      else {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_InterfaceBlockBaseCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_870,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_870,(char (*) [18])"Buffer size valid");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_870);
        local_3ec = 0;
      }
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_1e8);
  }
  local_3ec = 1;
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&program.m_program.m_info.linkTimeUs);
  return STOP;
}

Assistant:

InterfaceBlockDataSizeTestCase::IterateResult InterfaceBlockDataSizeTestCase::iterate (void)
{
	const ProgramInterface			programInterface		= (m_storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) :
															  (m_storage == glu::STORAGE_BUFFER) ? (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK) :
															  (PROGRAMINTERFACE_LAST);
	const glw::GLenum				programGLInterfaceValue	= getProgramInterfaceGLEnum(programInterface);
	const std::vector<std::string>	blockNames				= getProgramInterfaceResourceList(m_program, programInterface);
	glu::ShaderProgram				program					(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));

	DE_ASSERT(programInterface != PROGRAMINTERFACE_LAST);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// Verify all blocks
	for (int blockNdx = 0; blockNdx < (int)blockNames.size(); ++blockNdx)
	{
		const tcu::ScopedLogSection section				(m_testCtx.getLog(), "Block", "Block \"" + blockNames[blockNdx] + "\"");
		const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();
		const glw::GLuint			resourceNdx			= gl.getProgramResourceIndex(program.getProgram(), programGLInterfaceValue, blockNames[blockNdx].c_str());
		const int					expectedMinDataSize	= getBlockMinDataSize(blockNames[blockNdx]);
		glw::GLint					queryDataSize		= -1;

		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

		if (resourceNdx == GL_INVALID_INDEX)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, getProgramResourceIndex returned GL_INVALID_INDEX for \"" << blockNames[blockNdx] << "\"" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Resource not found");
			continue;
		}

		// query
		{
			const glw::GLenum prop = GL_BUFFER_DATA_SIZE;

			gl.getProgramResourceiv(program.getProgram(), programGLInterfaceValue, resourceNdx, 1, &prop, 1, DE_NULL, &queryDataSize);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query resource BUFFER_DATA_SIZE");
		}

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "BUFFER_DATA_SIZE = " << queryDataSize << "\n"
			<< "Buffer data size with tight packing: " << expectedMinDataSize
			<< tcu::TestLog::EndMessage;

		if (queryDataSize < expectedMinDataSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Error, buffer size was less than minimum buffer data size" << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer data size invalid");
			continue;
		}
		else
			m_testCtx.getLog() << tcu::TestLog::Message << "Buffer size valid" << tcu::TestLog::EndMessage;
	}

	return STOP;
}